

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGLDriver::COpenGLDriver
          (COpenGLDriver *this,SIrrlichtCreationParameters *params,IFileSystem *io,
          IContextManager *contextManager)

{
  SMaterial *pSVar1;
  undefined8 in_RCX;
  long in_RSI;
  undefined8 *in_RDI;
  dimension2d<unsigned_int> *in_stack_00000058;
  IFileSystem *in_stack_00000060;
  void **in_stack_00000068;
  CNullDriver *in_stack_00000070;
  SIrrlichtCreationParameters *in_stack_ffffffffffffffa8;
  COpenGLExtensionHandler *in_stack_ffffffffffffffb0;
  S3DVertex *this_00;
  S3DVertex *local_48;
  SMaterial *local_28;
  
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)(in_RDI + 0x21f));
  CNullDriver::CNullDriver(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058);
  IMaterialRendererServices::IMaterialRendererServices((IMaterialRendererServices *)(in_RDI + 0x92))
  ;
  COpenGLExtensionHandler::COpenGLExtensionHandler(in_stack_ffffffffffffffb0);
  *in_RDI = 0x43b888;
  in_RDI[0x21f] = 0x43bd70;
  in_RDI[1] = 0x43bcb8;
  in_RDI[0x92] = 0x43bcf8;
  in_RDI[0x17d] = 0;
  core::string<char>::string((string<char> *)0x338b16);
  pSVar1 = (SMaterial *)(in_RDI + 0x182);
  do {
    local_28 = pSVar1;
    core::CMatrix4<float>::CMatrix4
              ((CMatrix4<float> *)in_stack_ffffffffffffffb0,
               (eConstructor)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    pSVar1 = (SMaterial *)(local_28->TextureLayers + 2);
  } while ((SMaterial *)(local_28->TextureLayers + 2) != (SMaterial *)(in_RDI + 0x1ba));
  core::array<unsigned_char>::array((array<unsigned_char> *)in_stack_ffffffffffffffb0);
  *(undefined4 *)(in_RDI + 0x1be) = 0;
  *(undefined1 *)((long)in_RDI + 0xdf4) = 1;
  *(undefined1 *)((long)in_RDI + 0xdf5) = 1;
  *(undefined1 *)((long)in_RDI + 0xdf6) = *(undefined1 *)(in_RSI + 0x1f);
  SMaterial::SMaterial(local_28);
  SMaterial::SMaterial(local_28);
  core::array<irr::video::COpenGLDriver::SUserClipPlane>::array
            ((array<irr::video::COpenGLDriver::SUserClipPlane> *)in_stack_ffffffffffffffb0);
  core::string<char>::string((string<char> *)0x338bdc);
  core::CMatrix4<float>::CMatrix4
            ((CMatrix4<float> *)in_stack_ffffffffffffffb0,
             (eConstructor)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  *(undefined4 *)(in_RDI + 0x1fd) = 2;
  *(undefined4 *)((long)in_RDI + 0xfec) = 0;
  SIrrlichtCreationParameters::SIrrlichtCreationParameters
            ((SIrrlichtCreationParameters *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_48 = (S3DVertex *)(in_RDI + 0x20c);
  this_00 = (S3DVertex *)(in_RDI + 0x21e);
  do {
    S3DVertex::S3DVertex(this_00);
    local_48 = local_48 + 1;
  } while (local_48 != this_00);
  in_RDI[0x21e] = in_RCX;
  return;
}

Assistant:

COpenGLDriver::COpenGLDriver(const SIrrlichtCreationParameters &params, io::IFileSystem *io, IContextManager *contextManager) :
		CNullDriver(io, params.WindowSize), COpenGLExtensionHandler(), CacheHandler(0), CurrentRenderMode(ERM_NONE), ResetRenderStates(true),
		Transformation3DChanged(true), AntiAlias(params.AntiAlias), ColorFormat(ECF_R8G8B8), FixedPipelineState(EOFPS_ENABLE), Params(params),
		ContextManager(contextManager)
{
#ifdef _DEBUG
	setDebugName("COpenGLDriver");
#endif
}